

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

index_t __thiscall filtered_union_find::find(filtered_union_find *this,index_t x)

{
  int iVar1;
  pointer piVar2;
  index_t iVar3;
  int *piVar4;
  index_t y;
  int *piVar5;
  
  piVar2 = (this->parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = piVar2 + x;
  piVar5 = piVar4;
  iVar3 = x;
  while (iVar1 = *piVar5, iVar1 != iVar3) {
    iVar3 = iVar1;
    piVar5 = piVar2 + iVar1;
  }
  while (iVar1 = *piVar4, iVar3 != iVar1) {
    piVar2[x] = iVar3;
    x = iVar1;
    piVar4 = piVar2 + iVar1;
  }
  return iVar3;
}

Assistant:

index_t find(index_t x) {
		index_t y = x, z = parent[y];
		while (z != y) {
			y = z;
			z = parent[y];
		}
		y = parent[x];
		while (z != y) {
			parent[x] = z;
			x = y;
			y = parent[x];
		}
		return z;
	}